

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::argument_loader<char_const*,float>::load_impl_sequence<0ul,1ul>
          (argument_loader<char_const*,float> *this,long call)

{
  handle src;
  ulong uVar1;
  bool bVar2;
  undefined8 *puVar3;
  uint uVar4;
  
  puVar3 = *(undefined8 **)(call + 8);
  src.m_ptr = (PyObject *)*puVar3;
  if (src.m_ptr == (PyObject *)0x0) {
    return false;
  }
  uVar1 = **(ulong **)(call + 0x20);
  uVar4 = (uint)uVar1;
  if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
    if ((uVar1 & 1) == 0) {
      return false;
    }
    this[0x28] = (argument_loader<char_const*,float>)0x1;
  }
  else {
    bVar2 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    *)(this + 8),src,(bool)((byte)uVar1 & 1));
    if (!bVar2) {
      return false;
    }
    puVar3 = *(undefined8 **)(call + 8);
    uVar4 = (uint)**(undefined8 **)(call + 0x20);
  }
  bVar2 = type_caster<float,_void>::load
                    ((type_caster<float,_void> *)this,(PyObject *)puVar3[1],
                     SUB41((uVar4 & 2) >> 1,0));
  return bVar2;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }